

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<float,char_const(&)[6],double,char_const(&)[6],int>
          (String *__return_storage_ptr__,kj *this,float *params,char (*params_1) [6],
          double *params_2,char (*params_3) [6],int *params_4)

{
  float *value;
  char (*pacVar1) [6];
  double *value_00;
  int *value_01;
  String *params_4_00;
  CappedArray<char,_14UL> local_b8;
  ArrayPtr<const_char> local_a0;
  CappedArray<char,_32UL> local_90;
  ArrayPtr<const_char> local_68;
  CappedArray<char,_24UL> local_58;
  char (*local_38) [6];
  int *params_local_4;
  char (*params_local_3) [6];
  double *params_local_2;
  char (*params_local_1) [6];
  float *params_local;
  
  params_4_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (int *)params_2;
  params_local_3 = params_1;
  params_local_2 = (double *)params;
  params_local_1 = (char (*) [6])this;
  params_local = (float *)__return_storage_ptr__;
  value = fwd<float>((NoInfer<float> *)this);
  toCharSequence<float>(&local_58,value);
  pacVar1 = ::const((char (*) [6])params_local_2);
  local_68 = toCharSequence<char_const(&)[6]>(pacVar1);
  value_00 = fwd<double>((NoInfer<double> *)params_local_3);
  toCharSequence<double>(&local_90,value_00);
  pacVar1 = ::const((char (*) [6])params_local_4);
  local_a0 = toCharSequence<char_const(&)[6]>(pacVar1);
  value_01 = fwd<int>((NoInfer<int> *)local_38);
  toCharSequence<int>(&local_b8,value_01);
  _::
  concat<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (params_4_00,(_ *)&local_58,(CappedArray<char,_24UL> *)&local_68,
             (ArrayPtr<const_char> *)&local_90,(CappedArray<char,_32UL> *)&local_a0,
             (ArrayPtr<const_char> *)&local_b8,(CappedArray<char,_14UL> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}